

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O0

wchar_t tval_sval_list(char *name,int *list,wchar_t max_size)

{
  wchar_t wVar1;
  object_kind *kind;
  wchar_t tval;
  wchar_t num;
  size_t i;
  wchar_t max_size_local;
  int *list_local;
  char *name_local;
  
  kind._4_4_ = L'\0';
  wVar1 = tval_find_idx(name);
  if (wVar1 < L'\0') {
    name_local._4_4_ = L'\0';
  }
  else {
    for (_tval = 0; _tval < z_info->k_max; _tval = _tval + 1) {
      if ((k_info[_tval].tval != 0) && (k_info[_tval].tval == wVar1)) {
        if (max_size <= kind._4_4_) break;
        list[kind._4_4_] = k_info[_tval].sval;
        kind._4_4_ = kind._4_4_ + L'\x01';
      }
    }
    name_local._4_4_ = kind._4_4_;
  }
  return name_local._4_4_;
}

Assistant:

int tval_sval_list(const char *name, int *list, int max_size)
{
	size_t i;
	int num = 0;
	int tval = tval_find_idx(name);

	if (tval < 0) return 0;

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];

		if (!kind->tval) continue;
		if (kind->tval != tval) continue;
		if (num >= max_size) break;
		list[num++] = kind->sval;
	}

	return num;
}